

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int cmp(void *param_1,void *param_2)

{
  int i;
  long lVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = 0;
  iVar3 = 0;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    iVar2 = iVar2 + *(int *)(&stack0x00000018 + lVar1 * 4);
    iVar3 = iVar3 + *(int *)(&stack0x00000038 + lVar1 * 4);
  }
  return (int)(iVar3 < iVar2);
}

Assistant:

bool cmp(Student x ,Student y)
{
    int sumx = 0;
    int sumy = 0;
    for (int i = 0; i < 4; ++i) {
        sumx += x.socre[i];
        sumy += y.socre[i];
    }
    return sumx > sumy;
}